

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O3

nullres nullcCallFunction(NULLCFuncPtr ptr,...)

{
  char in_AL;
  bool bVar1;
  char *arguments;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint functionID;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  __va_list_tag local_e8;
  undefined1 local_c8 [16];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  functionID = ptr.id;
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
  }
  else {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &args[0].overflow_arg_area;
    local_e8.gp_offset = 0x10;
    local_e8.fp_offset = 0x30;
    local_b8 = in_RDX;
    local_b0 = in_RCX;
    local_a8 = in_R8;
    local_a0 = in_R9;
    arguments = nullcGetArgumentVector(functionID,(uintptr_t)ptr.context,&local_e8);
    if (arguments != (char *)0x0) {
      if (NULLC::currExec == 0) {
        bVar1 = ExecutorRegVm::Run(NULLC::executorRegVm,functionID,arguments);
        if (bVar1) {
          return '\x01';
        }
        NULLC::nullcLastError = ExecutorRegVm::GetErrorMessage(NULLC::executorRegVm);
      }
      else {
        if (NULLC::currExec != 1) {
          return '\x01';
        }
        bVar1 = ExecutorX86::Run(NULLC::executorX86,functionID,arguments);
        if (bVar1) {
          return '\x01';
        }
        NULLC::nullcLastError = ExecutorX86::GetErrorMessage(NULLC::executorX86);
      }
    }
  }
  return '\0';
}

Assistant:

nullres nullcCallFunction(NULLCFuncPtr ptr, ...)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	// Copy arguments in argument buffer
	va_list args;

	va_start(args, ptr);
	const char *argBuf = nullcGetArgumentVector(ptr.id, (uintptr_t)ptr.context, args);
	va_end(args);

	if(!argBuf)
		return false;
	
	if(currExec == NULLC_X86)
	{
#ifdef NULLC_BUILD_X86_JIT
		if(!executorX86->Run(ptr.id, argBuf))
		{
			nullcLastError = executorX86->GetErrorMessage();

			return false;
		}
#endif
	}
	else if(currExec == NULLC_LLVM)
	{
#ifdef NULLC_LLVM_SUPPORT
		if(!executorLLVM->Run(ptr.id, argBuf))
		{
			nullcLastError = executorLLVM->GetErrorMessage();

			return false;
		}
#endif
	}
	else if(currExec == NULLC_REG_VM)
	{
		if(!executorRegVm->Run(ptr.id, argBuf))
		{
			nullcLastError = executorRegVm->GetErrorMessage();

			return false;
		}
	}

	return true;
}